

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall PhPacker_Arg_f_Test::TestBody(PhPacker_Arg_f_Test *this)

{
  float *pfVar1;
  char *pcVar2;
  float result;
  float expected;
  string str;
  AssertHelper AStack_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined1 local_58 [8];
  _Storage local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  float local_34;
  float local_30;
  float local_2c;
  string local_28;
  
  PhPacker::pack<float,_0>(&local_28,'f',1.234);
  PhPacker::unpack((PhPacker *)local_58,'f',&local_28);
  pfVar1 = (float *)std::__any_caster<float>((any *)local_58);
  if (pfVar1 == (float *)0x0) {
    std::__throw_bad_any_cast();
  }
  local_30 = *pfVar1;
  if ((code *)CONCAT71(local_58._1_7_,local_58[0]) != (code *)0x0) {
    (*(code *)CONCAT71(local_58._1_7_,local_58[0]))(3,local_58,0);
  }
  local_34 = local_30;
  local_2c = 1.234;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_58,"result","expected",&local_34,&local_2c);
  if (local_58[0] == (PhPacker)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *local_50._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_ptr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_58 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_50._M_ptr);
    }
    PhPacker::pack<float,_0>((string *)local_58,'f',65232.12);
    std::__cxx11::string::operator=((string *)&local_28,(string *)local_58);
    if ((undefined1 *)CONCAT71(local_58._1_7_,local_58[0]) != local_58 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_58._1_7_,local_58[0]),
                      local_48._M_allocated_capacity + 1);
    }
    PhPacker::unpack((PhPacker *)local_58,'f',&local_28);
    pfVar1 = (float *)std::__any_caster<float>((any *)local_58);
    if (pfVar1 == (float *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_34 = *pfVar1;
    if ((code *)CONCAT71(local_58._1_7_,local_58[0]) != (code *)0x0) {
      (*(code *)CONCAT71(local_58._1_7_,local_58[0]))(3,local_58,0);
    }
    local_2c = 65232.12;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)local_58,"result","expected",&local_34,&local_2c);
    if (local_58[0] != (PhPacker)0x0) goto LAB_00110762;
    testing::Message::Message((Message *)&local_60);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_ptr ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *local_50._M_ptr;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x14e,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_68);
  if (local_60._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
LAB_00110762:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_ptr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_58 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_50._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PhPacker, Arg_f)
{
   std::string str = PhPacker::pack<float>('f', 1.234f);
   float result = std::any_cast<float>(PhPacker::unpack('f', str));
   float expected = 1.234f;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<float>('f', 65232.123f);
   result = std::any_cast<float>(PhPacker::unpack('f', str));
   expected = 65232.123f;
   GTEST_ASSERT_EQ(result, expected);
}